

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> * __thiscall
array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::operator=
          (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this,
          array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CRule *pCVar3;
  CRule *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  int i;
  long lVar9;
  
  set_size(this,other->num_elements);
  lVar8 = 0;
  for (lVar9 = 0; lVar9 < this->num_elements; lVar9 = lVar9 + 1) {
    pCVar3 = other->list;
    pCVar4 = this->list;
    *(undefined8 *)((long)&pCVar4->m_HFlip + lVar8) =
         *(undefined8 *)((long)&pCVar3->m_HFlip + lVar8);
    puVar1 = (undefined8 *)((long)&(pCVar3->m_Rect).field_0 + lVar8);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pCVar3->m_RelativePos).field_0 + lVar8);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pCVar4->m_RelativePos).field_0 + lVar8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    puVar1 = (undefined8 *)((long)&(pCVar4->m_Rect).field_0 + lVar8);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    lVar8 = lVar8 + 0x28;
  }
  return this;
}

Assistant:

array &operator = (const array &other)
	{
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
		return *this;
	}